

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O1

void __thiscall cmCTestCoverageHandler::LoadLabels(cmCTestCoverageHandler *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmCTest *this_00;
  bool bVar2;
  ostream *poVar3;
  string line;
  string fileList;
  ifstream finList;
  string local_268;
  string local_248;
  undefined1 local_228 [520];
  
  cmCTest::GetBinaryDir_abi_cxx11_(&local_248,(this->super_cmCTestGenericHandler).CTest);
  std::__cxx11::string::append((char *)&local_248);
  std::__cxx11::string::append((char *)&local_248);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_228," target directory list [",0x18);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_228,local_248._M_dataplus._M_p,local_248._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"]\n",2);
  this_00 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(this_00,5,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
               ,0x8b5,local_268._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
  paVar1 = &local_268.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar1) {
    operator_delete(local_268._M_dataplus._M_p,
                    CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                             local_268.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_228);
  std::ios_base::~ios_base((ios_base *)(local_228 + 0x70));
  std::ifstream::ifstream(local_228,local_248._M_dataplus._M_p,_S_in);
  local_268._M_string_length = 0;
  local_268.field_2._M_local_buf[0] = '\0';
  local_268._M_dataplus._M_p = (pointer)paVar1;
  while( true ) {
    bVar2 = cmsys::SystemTools::GetLineFromStream((istream *)local_228,&local_268,(bool *)0x0,-1);
    if (!bVar2) break;
    LoadLabels(this,local_268._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar1) {
    operator_delete(local_268._M_dataplus._M_p,
                    CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                             local_268.field_2._M_local_buf[0]) + 1);
  }
  std::ifstream::~ifstream(local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmCTestCoverageHandler::LoadLabels()
{
  std::string fileList = this->CTest->GetBinaryDir();
  fileList += "/CMakeFiles";
  fileList += "/TargetDirectories.txt";
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     " target directory list [" << fileList << "]\n",
                     this->Quiet);
  cmsys::ifstream finList(fileList.c_str());
  std::string line;
  while (cmSystemTools::GetLineFromStream(finList, line)) {
    this->LoadLabels(line.c_str());
  }
}